

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

void __thiscall QMetaType::QMetaType(QMetaType *this,int typeId)

{
  QMetaTypeInterface *d;
  QMetaType *in_RDI;
  
  d = interfaceForType((int)((ulong)in_RDI >> 0x20));
  QMetaType(in_RDI,d);
  return;
}

Assistant:

QMetaType::QMetaType(int typeId) : QMetaType(interfaceForType(typeId)) {}